

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_3f461::JSONParser::tokenError(JSONParser *this)

{
  bool bVar1;
  runtime_error *prVar2;
  char *pcVar3;
  allocator local_4e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  undefined1 local_441;
  string local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  undefined1 local_3d9;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_371;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  undefined1 local_309;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a1;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_23a;
  allocator local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_191;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_12a;
  allocator local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  JSONParser *local_10;
  JSONParser *this_local;
  
  local_10 = this;
  if ((this->done & 1U) != 0) {
    QTC::TC("libtests","JSON parse ls premature end of input",0);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"JSON: premature end of input");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->lex_state == ls_u4) {
    QTC::TC("libtests","JSON parse bad hex after u",0);
    local_81 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_80,~this->u_count + this->offset);
    std::operator+(&local_60,"JSON: offset ",&local_80);
    std::operator+(&local_40,&local_60,": \\u must be followed by four hex digits");
    std::runtime_error::runtime_error(prVar2,(string *)&local_40);
    local_81 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->lex_state == ls_alpha) {
    QTC::TC("libtests","JSON parse keyword bad character",0);
    local_12a = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_108,this->offset);
    std::operator+(&local_e8,"JSON: offset ",&local_108);
    std::operator+(&local_c8,&local_e8,": keyword: unexpected character ");
    pcVar3 = this->p;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,pcVar3,1,&local_129);
    std::operator+(&local_a8,&local_c8,&local_128);
    std::runtime_error::runtime_error(prVar2,(string *)&local_a8);
    local_12a = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->lex_state == ls_string) {
    QTC::TC("libtests","JSON parse control char in string",0);
    local_191 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_190,this->offset);
    std::operator+(&local_170,"JSON: offset ",&local_190);
    std::operator+(&local_150,&local_170,": control character in string (missing \"?)");
    std::runtime_error::runtime_error(prVar2,(string *)&local_150);
    local_191 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->lex_state == ls_backslash) {
    QTC::TC("libtests","JSON parse backslash bad character",0);
    local_23a = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_218,this->offset);
    std::operator+(&local_1f8,"JSON: offset ",&local_218);
    std::operator+(&local_1d8,&local_1f8,": invalid character after backslash: ");
    pcVar3 = this->p;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_238,pcVar3,1,&local_239);
    std::operator+(&local_1b8,&local_1d8,&local_238);
    std::runtime_error::runtime_error(prVar2,(string *)&local_1b8);
    local_23a = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*this->p == '.') {
    if (((this->lex_state != ls_number) && (this->lex_state != ls_number_e)) &&
       (this->lex_state != ls_number_e_sign)) {
      QTC::TC("libtests","JSON parse duplicate point",0);
      local_309 = 1;
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_308,this->offset);
      std::operator+(&local_2e8,"JSON: offset ",&local_308);
      std::operator+(&local_2c8,&local_2e8,": numeric literal: decimal point already seen");
      std::runtime_error::runtime_error(prVar2,(string *)&local_2c8);
      local_309 = 0;
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    QTC::TC("libtests","JSON parse point after e",0);
    local_2a1 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_2a0,this->offset);
    std::operator+(&local_280,"JSON: offset ",&local_2a0);
    std::operator+(&local_260,&local_280,": numeric literal: decimal point after e");
    std::runtime_error::runtime_error(prVar2,(string *)&local_260);
    local_2a1 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*this->p == 'e') || (*this->p == 'E')) {
    QTC::TC("libtests","JSON parse duplicate e",0);
    local_371 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_370,this->offset);
    std::operator+(&local_350,"JSON: offset ",&local_370);
    std::operator+(&local_330,&local_350,": numeric literal: e already seen");
    std::runtime_error::runtime_error(prVar2,(string *)&local_330);
    local_371 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*this->p != '+') && (*this->p != '-')) {
    bVar1 = ::qpdf::util::is_space(*this->p);
    if (!bVar1) {
      pcVar3 = strchr("{}[]:,",(int)*this->p);
      if (pcVar3 == (char *)0x0) {
        QTC::TC("libtests","JSON parse numeric bad character",0);
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_4c8,this->offset);
        std::operator+(&local_4a8,"JSON: offset ",&local_4c8);
        std::operator+(&local_488,&local_4a8,": numeric literal: unexpected character ");
        pcVar3 = this->p;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_4e8,pcVar3,1,&local_4e9);
        std::operator+(&local_468,&local_488,&local_4e8);
        std::runtime_error::runtime_error(prVar2,(string *)&local_468);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    QTC::TC("libtests","JSON parse incomplete number",0);
    local_441 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_440,this->offset);
    std::operator+(&local_420,"JSON: offset ",&local_440);
    std::operator+(&local_400,&local_420,": numeric literal: incomplete number");
    std::runtime_error::runtime_error(prVar2,(string *)&local_400);
    local_441 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  QTC::TC("libtests","JSON parse unexpected sign",0);
  local_3d9 = 1;
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_3d8,this->offset);
  std::operator+(&local_3b8,"JSON: offset ",&local_3d8);
  std::operator+(&local_398,&local_3b8,": numeric literal: unexpected sign");
  std::runtime_error::runtime_error(prVar2,(string *)&local_398);
  local_3d9 = 0;
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
JSONParser::tokenError()
{
    if (done) {
        QTC::TC("libtests", "JSON parse ls premature end of input");
        throw std::runtime_error("JSON: premature end of input");
    }

    if (lex_state == ls_u4) {
        QTC::TC("libtests", "JSON parse bad hex after u");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset - u_count - 1) +
            ": \\u must be followed by four hex digits");
    } else if (lex_state == ls_alpha) {
        QTC::TC("libtests", "JSON parse keyword bad character");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": keyword: unexpected character " +
            std::string(p, 1));
    } else if (lex_state == ls_string) {
        QTC::TC("libtests", "JSON parse control char in string");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) +
            ": control character in string (missing \"?)");
    } else if (lex_state == ls_backslash) {
        QTC::TC("libtests", "JSON parse backslash bad character");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) +
            ": invalid character after backslash: " + std::string(p, 1));
    }

    if (*p == '.') {
        if (lex_state == ls_number || lex_state == ls_number_e || lex_state == ls_number_e_sign) {
            QTC::TC("libtests", "JSON parse point after e");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) +
                ": numeric literal: decimal point after e");
        } else {
            QTC::TC("libtests", "JSON parse duplicate point");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) +
                ": numeric literal: decimal point already seen");
        }
    } else if (*p == 'e' || *p == 'E') {
        QTC::TC("libtests", "JSON parse duplicate e");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": numeric literal: e already seen");
    } else if ((*p == '+') || (*p == '-')) {
        QTC::TC("libtests", "JSON parse unexpected sign");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": numeric literal: unexpected sign");
    } else if (util::is_space(*p) || strchr("{}[]:,", *p)) {
        QTC::TC("libtests", "JSON parse incomplete number");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": numeric literal: incomplete number");

    } else {
        QTC::TC("libtests", "JSON parse numeric bad character");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": numeric literal: unexpected character " +
            std::string(p, 1));
    }
    throw std::logic_error("JSON::tokenError : unhandled error");
}